

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O2

_Bool find_device_by_id_callback(LIST_ITEM_HANDLE list_item,void *match_context)

{
  undefined8 *puVar1;
  char *pcVar2;
  _Bool _Var3;
  
  if (match_context != (void *)0x0) {
    puVar1 = (undefined8 *)singlylinkedlist_item_get_value(list_item);
    if ((puVar1 == (undefined8 *)0x0) || ((STRING_HANDLE)*puVar1 == (STRING_HANDLE)0x0)) {
      _Var3 = false;
    }
    else {
      pcVar2 = STRING_c_str((STRING_HANDLE)*puVar1);
      _Var3 = pcVar2 == (char *)match_context;
    }
    return _Var3;
  }
  return false;
}

Assistant:

static bool find_device_by_id_callback(LIST_ITEM_HANDLE list_item, const void* match_context)
{
    bool result;

    if (match_context == NULL)
    {
        result = false;
    }
    else
    {
        AMQP_TRANSPORT_DEVICE_INSTANCE* device_instance = (AMQP_TRANSPORT_DEVICE_INSTANCE*)singlylinkedlist_item_get_value(list_item);

        if (device_instance == NULL ||
            device_instance->device_id == NULL ||
            STRING_c_str(device_instance->device_id) != match_context)
        {
            result = false;
        }
        else
        {
            result = true;
        }
    }

    return result;
}